

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Zero24(void *destinationBuffer,int destinationStride,uint count)

{
  undefined1 *local_20;
  uchar *dest;
  uint count_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  local_20 = (undefined1 *)destinationBuffer;
  dest._0_4_ = count;
  while ((uint)dest != 0) {
    *local_20 = 0;
    local_20[1] = 0;
    local_20[2] = 0;
    local_20 = local_20 + destinationStride * 3;
    dest._0_4_ = (uint)dest - 1;
  }
  return;
}

Assistant:

static void Zero24( void *destinationBuffer, signed int destinationStride,
        unsigned int count )
{
    unsigned char *dest = (unsigned char*)destinationBuffer;

    while( count-- )
    {
        dest[0] = 0;
        dest[1] = 0;
        dest[2] = 0;

        dest += destinationStride * 3;
    }
}